

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char **ppcVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  int unaff_R13D;
  byte *pbVar6;
  
  pbVar6 = (byte *)ptr;
  do {
    if (pbVar6 == (byte *)end) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar6);
    ppcVar5 = (char **)(ulong)bVar1;
    switch(ppcVar5) {
    case (char **)0x0:
    case (char **)0x1:
    case (char **)0x8:
      break;
    default:
      pbVar6 = pbVar6 + 1;
LAB_001569eb:
      bVar2 = true;
      goto LAB_001569de;
    case (char **)0x5:
      if (1 < (long)end - (long)pbVar6) {
        iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar6,ptr,ppcVar5);
        ptr = extraout_RDX_00;
        if (iVar4 == 0) {
          pbVar6 = pbVar6 + 2;
          goto LAB_001569eb;
        }
        break;
      }
LAB_001569d6:
      unaff_R13D = -2;
      goto LAB_001569dc;
    case (char **)0x6:
      if ((long)end - (long)pbVar6 < 3) goto LAB_001569d6;
      iVar4 = (*enc[3].scanners[3])(enc,(char *)pbVar6,ptr,ppcVar5);
      ptr = extraout_RDX_01;
      if (iVar4 == 0) {
        pbVar6 = pbVar6 + 3;
        goto LAB_001569eb;
      }
      break;
    case (char **)0x7:
      if ((long)end - (long)pbVar6 < 4) goto LAB_001569d6;
      iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar6,ptr,ppcVar5);
      ptr = extraout_RDX;
      if (iVar4 == 0) {
        pbVar6 = pbVar6 + 4;
        goto LAB_001569eb;
      }
      break;
    case (char **)0xc:
    case (char **)0xd:
      pbVar6 = pbVar6 + 1;
      bVar2 = true;
      if ((uint)bVar1 == open) {
        if (pbVar6 == (byte *)end) {
          unaff_R13D = -0x1b;
        }
        else {
          *nextTokPtr = (char *)pbVar6;
          unaff_R13D = 0;
          uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar6);
          if ((uVar3 < 0x1f) && ((0x40300e00U >> (uVar3 & 0x1f) & 1) != 0)) {
            unaff_R13D = 0x1b;
          }
        }
        goto LAB_001569dc;
      }
      goto LAB_001569de;
    }
    *nextTokPtr = (char *)pbVar6;
    unaff_R13D = 0;
LAB_001569dc:
    bVar2 = false;
LAB_001569de:
    if (!bVar2) {
      return unaff_R13D;
    }
  } while( true );
}

Assistant:

static
int PREFIX(scanLit)(int open, const ENCODING *enc,
                    const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  while (ptr != end) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (ptr == end)
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}